

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  SourceLineInfo *_lineInfo;
  size_t *psVar1;
  TestCase *_name;
  IStreamingReporter *pIVar2;
  size_t sVar3;
  TestCaseTracker *this_00;
  pointer pUVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool _missingAssertions;
  uint uVar7;
  pointer pUVar8;
  SectionInfo testCaseSection;
  StreamRedirect cerrRedir;
  SectionStats testCaseSectionStats;
  allocator local_512;
  allocator local_511;
  double local_510;
  string local_508;
  size_t local_4e8;
  size_t sStack_4e0;
  SectionInfo local_4d0;
  undefined1 local_468 [408];
  StreamRedirect local_2d0;
  
  _name = this->m_activeTestCase;
  _lineInfo = &(_name->super_TestCaseInfo).lineInfo;
  SectionInfo::SectionInfo
            (&local_4d0,_lineInfo,(string *)_name,&(_name->super_TestCaseInfo).description);
  pIVar2 = (this->m_reporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[9])(pIVar2,&local_4d0);
  local_4e8 = (this->m_totals).assertions.passed;
  sStack_4e0 = (this->m_totals).assertions.failed;
  sVar3 = (this->m_totals).assertions.failedButOk;
  std::__cxx11::string::string((string *)local_468,"TEST_CASE",&local_511);
  std::__cxx11::string::string((string *)&local_508,"",&local_512);
  AssertionInfo::AssertionInfo
            ((AssertionInfo *)&local_2d0,(string *)local_468,_lineInfo,&local_508,Normal);
  AssertionInfo::operator=(&this->m_lastAssertionInfo,(AssertionInfo *)&local_2d0);
  AssertionInfo::~AssertionInfo((AssertionInfo *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)local_468);
  this_00 = (this->m_testCaseTracker).nullableValue;
  this_00->m_currentSection = &this_00->m_testCase;
  this_00->m_completedASectionThisRun = false;
  if ((this_00->m_testCase).m_runState == NotStarted) {
    (this_00->m_testCase).m_runState = Executing;
  }
  local_508._M_dataplus._M_p = (pointer)anon_unknown_27::getCurrentTicks();
  uVar7 = (*(((this->m_reporter).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[4])();
  if ((uVar7 & 1) == 0) {
    (*(((this->m_activeTestCase->test).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[4])
              ();
  }
  else {
    StreamRedirect::StreamRedirect(&local_2d0,(ostream *)&std::cout,redirectedCout);
    StreamRedirect::StreamRedirect((StreamRedirect *)local_468,(ostream *)&std::cerr,redirectedCerr)
    ;
    (*(((this->m_activeTestCase->test).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[4])
              ();
    StreamRedirect::~StreamRedirect((StreamRedirect *)local_468);
    StreamRedirect::~StreamRedirect(&local_2d0);
  }
  local_510 = Timer::getElapsedSeconds((Timer *)&local_508);
  SectionTracking::TrackedSection::leave(&this_00->m_testCase);
  pUVar4 = (this->m_unfinishedSections).
           super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pUVar8 = (this->m_unfinishedSections).
           super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while (pUVar8 != pUVar4) {
    (*(this->super_IResultCapture)._vptr_IResultCapture[4])
              (pUVar8[-1].durationInSeconds,this,pUVar8 + -1,&pUVar8[-1].prevAssertions);
    pUVar8 = pUVar8 + -1;
  }
  std::
  vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  ::clear(&this->m_unfinishedSections);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear(&this->m_messages);
  local_468._0_8_ = (this->m_totals).assertions.passed - local_4e8;
  local_468._8_8_ = (this->m_totals).assertions.failed - sStack_4e0;
  local_468._16_8_ = (this->m_totals).assertions.failedButOk - sVar3;
  _missingAssertions = testForMissingAssertions(this,(Counts *)local_468);
  uVar6 = local_468._16_8_;
  uVar5 = local_468._8_8_;
  if (((_name->super_TestCaseInfo).properties & (MayFail|ShouldFail)) != None) {
    local_468._16_8_ = local_468._8_8_;
    local_468._8_8_ = uVar6;
    psVar1 = &(this->m_totals).assertions.failed;
    *psVar1 = *psVar1 - uVar5;
    psVar1 = &(this->m_totals).assertions.failedButOk;
    *psVar1 = (size_t)(uVar5 + *psVar1);
  }
  SectionStats::SectionStats
            ((SectionStats *)&local_2d0,&local_4d0,(Counts *)local_468,local_510,_missingAssertions)
  ;
  pIVar2 = (this->m_reporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar2,&local_2d0);
  SectionStats::~SectionStats((SectionStats *)&local_2d0);
  SectionInfo::~SectionInfo(&local_4d0);
  return;
}

Assistant:

void runCurrentTest( std::string& redirectedCout, std::string& redirectedCerr ) {
            TestCaseInfo const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
            SectionInfo testCaseSection( testCaseInfo.lineInfo, testCaseInfo.name, testCaseInfo.description );
            m_reporter->sectionStarting( testCaseSection );
            Counts prevAssertions = m_totals.assertions;
            double duration = 0;
            try {
                m_lastAssertionInfo = AssertionInfo( "TEST_CASE", testCaseInfo.lineInfo, "", ResultDisposition::Normal );
                TestCaseTracker::Guard guard( *m_testCaseTracker );

                Timer timer;
                timer.start();
                if( m_reporter->getPreferences().shouldRedirectStdOut ) {
                    StreamRedirect coutRedir( std::cout, redirectedCout );
                    StreamRedirect cerrRedir( std::cerr, redirectedCerr );
                    m_activeTestCase->invoke();
                }
                else {
                    m_activeTestCase->invoke();
                }
                duration = timer.getElapsedSeconds();
            }
            catch( TestFailureException& ) {
                // This just means the test was aborted due to failure
            }
            catch(...) {
                ResultBuilder exResult( m_lastAssertionInfo.macroName.c_str(),
                                        m_lastAssertionInfo.lineInfo,
                                        m_lastAssertionInfo.capturedExpression.c_str(),
                                        m_lastAssertionInfo.resultDisposition );
                exResult.useActiveException();
            }
            // If sections ended prematurely due to an exception we stored their
            // infos here so we can tear them down outside the unwind process.
            for( std::vector<UnfinishedSections>::const_reverse_iterator it = m_unfinishedSections.rbegin(),
                        itEnd = m_unfinishedSections.rend();
                    it != itEnd;
                    ++it )
                sectionEnded( it->info, it->prevAssertions, it->durationInSeconds );
            m_unfinishedSections.clear();
            m_messages.clear();

            Counts assertions = m_totals.assertions - prevAssertions;
            bool missingAssertions = testForMissingAssertions( assertions );

            if( testCaseInfo.okToFail() ) {
                std::swap( assertions.failedButOk, assertions.failed );
                m_totals.assertions.failed -= assertions.failedButOk;
                m_totals.assertions.failedButOk += assertions.failedButOk;
            }

            SectionStats testCaseSectionStats( testCaseSection, assertions, duration, missingAssertions );
            m_reporter->sectionEnded( testCaseSectionStats );
        }